

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall despot::Parser::Print(Parser *this,ostream *out)

{
  char cVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"State variables",0xf);
  cVar1 = (char)out;
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if ((this->curr_state_vars_).
      super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->curr_state_vars_).
      super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"s[",2);
      poVar2 = (ostream *)std::ostream::operator<<(out,(int)uVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] = ",4);
      poVar2 = despot::operator<<(poVar2,(StateVar *)
                                         ((long)&(((this->curr_state_vars_).
                                                                                                      
                                                  super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super_NamedVar).super_Variable._vptr_Variable +
                                         lVar5));
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
      uVar3 = ((long)(this->curr_state_vars_).
                     super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(this->curr_state_vars_).
                     super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl
                     .super__Vector_impl_data._M_start >> 6) * -0x5555555555555555;
      lVar5 = lVar5 + 0xc0;
    } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
  }
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Observation variables",0x15);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if ((this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"o[",2);
      poVar2 = (ostream *)std::ostream::operator<<(out,(int)uVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] = ",4);
      poVar2 = despot::operator<<(poVar2,(NamedVar *)
                                         ((long)&(((this->obs_vars_).
                                                                                                      
                                                  super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super_Variable)._vptr_Variable + lVar5));
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
      uVar3 = ((long)(this->obs_vars_).
                     super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(this->obs_vars_).
                     super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
      lVar5 = lVar5 + 0x78;
    } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
  }
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"# Initial belief",0x10);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if ((this->initial_belief_funcs_).
      super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->initial_belief_funcs_).
      super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"s[",2);
      poVar2 = (ostream *)std::ostream::operator<<(out,(int)uVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] = ",4);
      poVar2 = despot::operator<<(poVar2,(Function *)
                                         ((long)&(((this->initial_belief_funcs_).
                                                                                                      
                                                  super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super_CPT).super_Function._vptr_Function + lVar5));
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
      uVar3 = ((long)(this->initial_belief_funcs_).
                     super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->initial_belief_funcs_).
                     super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      lVar5 = lVar5 + 0x70;
    } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
  }
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"# Transition probabilities",0x1a);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if ((this->transition_funcs_).super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->transition_funcs_).super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"s[",2);
      poVar2 = (ostream *)std::ostream::operator<<(out,(int)uVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] = ",4);
      poVar2 = despot::operator<<(poVar2,&(this->transition_funcs_).
                                          super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar4]->
                                          super_Function);
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(this->transition_funcs_).
                                   super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->transition_funcs_).
                                   super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"# Observation probabilities",0x1b);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if ((this->obs_funcs_).super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->obs_funcs_).super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"o[",2);
      poVar2 = (ostream *)std::ostream::operator<<(out,(int)uVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] = ",4);
      poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(this->obs_funcs_).
                                   super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->obs_funcs_).
                                   super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"# Reward functions",0x12);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if ((this->reward_funcs_).super__Vector_base<despot::Function,_std::allocator<despot::Function>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->reward_funcs_).super__Vector_base<despot::Function,_std::allocator<despot::Function>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"r[",2);
      poVar2 = (ostream *)std::ostream::operator<<(out,(int)uVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] = ",4);
      poVar2 = despot::operator<<(poVar2,(Function *)
                                         ((long)&((this->reward_funcs_).
                                                  super__Vector_base<despot::Function,_std::allocator<despot::Function>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _vptr_Function + lVar5));
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
      uVar3 = ((long)(this->reward_funcs_).
                     super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(this->reward_funcs_).
                     super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      lVar5 = lVar5 + 0x58;
    } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
  }
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Parser::Print(ostream& out) const {
	out << "State variables" << endl;
	for (int s = 0; s < curr_state_vars_.size(); s++) {
		out << "s[" << s << "] = " << curr_state_vars_[s] << endl;
	}
	out << endl;

	out << "Observation variables" << endl;
	for (int o = 0; o < obs_vars_.size(); o++) {
		out << "o[" << o << "] = " << obs_vars_[o] << endl;
	}
	out << endl;

	out << "# Initial belief" << endl;
	for (int s = 0; s < initial_belief_funcs_.size(); s++) {
		out << "s[" << s << "] = " << initial_belief_funcs_[s] << endl;
	}
	out << endl;

	out << "# Transition probabilities" << endl;
	for (int s = 0; s < transition_funcs_.size(); s++) {
		out << "s[" << s << "] = " << *transition_funcs_[s] << endl;
	}
	out << endl;

	out << "# Observation probabilities" << endl;
	for (int o = 0; o < obs_funcs_.size(); o++) {
		out << "o[" << o << "] = " << obs_funcs_[o] << endl;
	}
	out << endl;

	out << "# Reward functions" << endl;
	for (int r = 0; r < reward_funcs_.size(); r++) {
		out << "r[" << r << "] = " << reward_funcs_[r] << endl;
	}
	out << endl;
}